

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int regcomp(regex_t *__preg,char *__pattern,int __cflags)

{
  re_guts *g_00;
  sopno sVar1;
  size_t new_ssize;
  size_t len;
  uint i;
  parse *p;
  re_guts *g;
  parse pa;
  int cflags_local;
  char *pattern_local;
  regex_t *preg_local;
  
  if (((__cflags & 1U) == 0) || ((__cflags & 0x10U) == 0)) {
    pa.pend[9]._4_4_ = __cflags;
    if ((__cflags & 0x20U) == 0) {
      new_ssize = strlen(__pattern);
    }
    else {
      if ((char *)__preg->used < __pattern) {
        return 0x10;
      }
      new_ssize = __preg->used - (long)__pattern;
    }
    g_00 = (re_guts *)malloc(399);
    if (g_00 == (re_guts *)0x0) {
      preg_local._4_4_ = 0xc;
    }
    else {
      pa.strip = (sop *)((new_ssize >> 1) * 3 + 1);
      if ((pa.strip < new_ssize) || ((sop *)0xfffffffffffffff < pa.strip)) {
        free(g_00);
        preg_local._4_4_ = 0x10;
      }
      else {
        pa._16_8_ = malloc((long)pa.strip * 8);
        pa.ssize = 0;
        if ((void *)pa._16_8_ == (void *)0x0) {
          free(g_00);
          preg_local._4_4_ = 0xc;
        }
        else {
          pa.next = __pattern + new_ssize;
          pa.end._0_4_ = 0;
          pa.slen._0_4_ = 0;
          for (len._4_4_ = 0; len._4_4_ < 10; len._4_4_ = len._4_4_ + 1) {
            pa.pbegin[(ulong)len._4_4_ - 1] = 0;
            pa.pbegin[(ulong)len._4_4_ + 9] = 0;
          }
          g_00->csetsize = 0x100;
          g_00->sets = (cset *)0x0;
          g_00->setbits = (uch *)0x0;
          g_00->ncsets = 0;
          g_00->cflags = pa.pend[9]._4_4_;
          g_00->iflags = 0;
          g_00->nbol = 0;
          g_00->neol = 0;
          g_00->must = (char *)0x0;
          g_00->mlen = 0;
          g_00->nsub = 0;
          g_00->ncategories = 1;
          g_00->categories = (cat_t *)&g_00[1].backrefs;
          g = (re_guts *)__pattern;
          pa._48_8_ = g_00;
          memset(g_00->catspace,0,0x100);
          g_00->backrefs = 0;
          doemit((parse *)&g,0x4000000,0);
          g_00->firststate = pa.ssize + -1;
          if ((pa.pend[9]._4_4_ & 1) == 0) {
            if ((pa.pend[9]._4_4_ & 0x10) == 0) {
              p_bre((parse *)&g,0x80,0x80);
            }
            else {
              p_str((parse *)&g);
            }
          }
          else {
            p_ere((parse *)&g,0x80);
          }
          doemit((parse *)&g,0x4000000,0);
          g_00->laststate = pa.ssize + -1;
          categorize((parse *)&g,g_00);
          stripsnug((parse *)&g,g_00);
          findmust((parse *)&g,g_00);
          sVar1 = pluscount((parse *)&g,g_00);
          g_00->nplus = sVar1;
          g_00->magic = 0xd245;
          __preg->allocated = g_00->nsub;
          __preg->syntax = (reg_syntax_t)g_00;
          *(undefined4 *)&__preg->buffer = 0xf265;
          if ((int)pa.end != 0) {
            regfree(__preg);
          }
          preg_local._4_4_ = (int)pa.end;
        }
      }
    }
  }
  else {
    preg_local._4_4_ = 0x10;
  }
  return preg_local._4_4_;
}

Assistant:

int				/* 0 success, otherwise REG_something */
regcomp(preg, pattern, cflags)
regex_t *preg;
const char *pattern;
int cflags;
{
	struct parse pa;
	struct re_guts *g;
	struct parse *p = &pa;
	unsigned int i;
	size_t len;

	if ((cflags&REG_EXTENDED) && (cflags&REG_NOSPEC))
		return(REG_INVARG);

	if (cflags&REG_PEND) {
		if (preg->re_endp < pattern)
			return(REG_INVARG);
		len = (size_t) (preg->re_endp - pattern);
	} else
		len = strlen((char *)pattern);

	/* do the mallocs early so failure handling is easy */
	g = (struct re_guts *)malloc(sizeof(struct re_guts) +
							(NC-1)*sizeof(cat_t));
	if (g == NULL)
		return(REG_ESPACE);
	{
	  /* Patched for CERT Vulnerability Note VU#695940, Feb 2015. */
	  size_t new_ssize = len/(size_t)2*(size_t)3 + (size_t)1; /* ugh */
	  if (new_ssize < len || new_ssize > LONG_MAX / sizeof(sop)) {
	    free((char *) g);
	    return REG_INVARG;
	  }
	  p->ssize = (sopno)new_ssize;
	}
	p->strip = (sop *)malloc((size_t)p->ssize * sizeof(sop));
	p->slen = 0;
	if (p->strip == NULL) {
		free((char *)g);
		return(REG_ESPACE);
	}

	/* set things up */
	p->g = g;
	p->next = (char *)pattern;	/* convenience; we do not modify it */
	p->end = p->next + len;
	p->error = 0;
	p->ncsalloc = 0;
	for (i = 0; i < NPAREN; i++) {
		p->pbegin[i] = 0;
		p->pend[i] = 0;
	}
	g->csetsize = NC;
	g->sets = NULL;
	g->setbits = NULL;
	g->ncsets = 0;
	g->cflags = cflags;
	g->iflags = 0;
	g->nbol = 0;
	g->neol = 0;
	g->must = NULL;
	g->mlen = 0;
	g->nsub = 0;
	g->ncategories = 1;	/* category 0 is "everything else" */
	g->categories = &g->catspace[-(CHAR_MIN)];
	(void) memset((char *)g->catspace, 0, NC*sizeof(cat_t));
	g->backrefs = 0;

	/* do it */
	EMIT(OEND, 0);
	g->firststate = THERE();
	if (cflags&REG_EXTENDED)
		p_ere(p, OUT);
	else if (cflags&REG_NOSPEC)
		p_str(p);
	else
		p_bre(p, OUT, OUT);
	EMIT(OEND, 0);
	g->laststate = THERE();

	/* tidy up loose ends and fill things in */
	categorize(p, g);
	stripsnug(p, g);
	findmust(p, g);
	g->nplus = pluscount(p, g);
	g->magic = MAGIC2;
	preg->re_nsub = g->nsub;
	preg->re_g = g;
	preg->re_magic = MAGIC1;
#ifndef REDEBUG
	/* not debugging, so can't rely on the assert() in regexec() */
	if (g->iflags&BAD)
		seterr(p, REG_ASSERT);
#endif

	/* win or lose, we're done */
	if (p->error != 0)	/* lose */
		regfree(preg);
	return(p->error);
}